

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O0

Int __thiscall ipx::Maxvolume::Driver(Maxvolume *this,Basis *basis,Slice *slice)

{
  Control *pCVar1;
  const_reference cVar2;
  bool bVar3;
  Int IVar4;
  double *pdVar5;
  reference pvVar6;
  IndexedVector *row_00;
  ostream *poVar7;
  ostream *poVar8;
  valarray<double> *in_RDX;
  Basis *in_RSI;
  int iVar9;
  undefined8 *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar10;
  double dVar11;
  anon_class_24_3_eb8ddd5c add;
  double alpha;
  double dbinv;
  double dn;
  bool exchanged;
  double pivot;
  Int jb;
  anon_class_16_2_b7367452 sum_used;
  double weight_recomp;
  double vmax;
  double scaled_pivot;
  Int pmax;
  double weight;
  Int jn;
  Int skipped;
  vector<int,_std::allocator<int>_> candidates;
  double sum;
  Int j;
  Int p;
  Vector *work;
  IndexedVector *row;
  IndexedVector *lhs;
  Vector *colweights;
  vector<bool,_std::allocator<bool>_> *tblrow_used;
  Vector *invscale_basic;
  Vector *colscale;
  Int maxskip;
  double volumetol;
  Int errflag;
  SparseMatrix *AI;
  Int n;
  Int m;
  Model *model;
  undefined4 in_stack_fffffffffffffd58;
  Int in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  Vector *in_stack_fffffffffffffd68;
  Basis *in_stack_fffffffffffffd70;
  double *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined2 in_stack_fffffffffffffd84;
  undefined1 in_stack_fffffffffffffd86;
  undefined1 in_stack_fffffffffffffd87;
  IndexedVector *in_stack_fffffffffffffd88;
  Control *in_stack_fffffffffffffd90;
  Basis *in_stack_fffffffffffffd98;
  Maxvolume *in_stack_fffffffffffffda0;
  IndexedVector *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdb8;
  Basis *in_stack_fffffffffffffdc0;
  Vector *in_stack_fffffffffffffdc8;
  Int in_stack_fffffffffffffdd4;
  Control *in_stack_fffffffffffffdd8;
  undefined1 ignore_fixed;
  IndexedVector *in_stack_fffffffffffffe50;
  double in_stack_fffffffffffffe58;
  Basis *in_stack_fffffffffffffe60;
  Basis *local_198;
  byte local_151;
  string local_150 [32];
  double local_130;
  Int local_124;
  valarray<double> *local_120;
  double *local_118;
  double local_110;
  double local_108;
  double local_100;
  Int local_f4;
  double local_f0;
  int local_e8;
  int local_bc;
  IndexedVector *local_a0;
  int local_98;
  int local_94;
  valarray<double> *local_90;
  double **local_88;
  double **local_80;
  valarray<double> *local_78;
  valarray<double> *local_70;
  valarray<double> *local_68;
  valarray<double> *local_60;
  ipxint local_54;
  double local_50;
  double local_48;
  double local_40;
  Int local_34;
  SparseMatrix *local_30;
  Int local_28;
  Int local_24;
  Model *local_20;
  valarray<double> *local_18;
  
  local_18 = in_RDX;
  local_20 = Basis::model(in_RSI);
  local_24 = Model::rows(local_20);
  local_28 = Model::cols(local_20);
  local_30 = Model::AI(local_20);
  local_34 = 0;
  local_48 = Control::volume_tol((Control *)*in_RDI);
  local_50 = 1.0;
  pdVar5 = std::max<double>(&local_48,&local_50);
  local_40 = *pdVar5;
  local_54 = Control::maxskip_updates((Control *)*in_RDI);
  local_60 = local_18;
  local_68 = local_18 + 1;
  local_70 = local_18 + 2;
  local_78 = (valarray<double> *)&local_18[4]._M_data;
  local_80 = &local_18[5]._M_data;
  local_88 = &local_18[8]._M_data;
  local_90 = (valarray<double> *)&local_18[0xb]._M_data;
  for (local_94 = 0; local_94 < local_24; local_94 = local_94 + 1) {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT17(in_stack_fffffffffffffd87,
                                CONCAT16(in_stack_fffffffffffffd86,
                                         CONCAT24(in_stack_fffffffffffffd84,
                                                  in_stack_fffffffffffffd80))),
                       (size_type)in_stack_fffffffffffffd78);
    if (cVar2) {
      pdVar5 = std::valarray<double>::operator[](local_68,(long)local_94);
      local_198 = (Basis *)*pdVar5;
    }
    else {
      local_198 = (Basis *)0x0;
    }
    pdVar5 = std::valarray<double>::operator[](local_90,(long)local_94);
    *pdVar5 = (double)local_198;
    in_stack_fffffffffffffe60 = local_198;
  }
  Basis::SolveDense(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                    (Vector *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                    (char)((uint)in_stack_fffffffffffffd5c >> 0x18));
  for (local_98 = 0; local_98 < local_28 + local_24; local_98 = local_98 + 1) {
    pdVar5 = std::valarray<double>::operator[](local_60,(long)local_98);
    if ((*pdVar5 != 0.0) || (NAN(*pdVar5))) {
      in_stack_fffffffffffffe50 =
           (IndexedVector *)
           DotColumn((SparseMatrix *)in_stack_fffffffffffffd90,
                     (Int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                     (Vector *)
                     CONCAT17(in_stack_fffffffffffffd87,
                              CONCAT16(in_stack_fffffffffffffd86,
                                       CONCAT24(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                                      )));
      local_a0 = in_stack_fffffffffffffe50;
      pdVar5 = std::valarray<double>::operator[](local_60,(long)local_98);
      in_stack_fffffffffffffe58 = (double)in_stack_fffffffffffffe50 * *pdVar5;
      pdVar5 = std::valarray<double>::operator[](local_78,(long)local_98);
      *pdVar5 = in_stack_fffffffffffffe58;
    }
    else {
      pdVar5 = std::valarray<double>::operator[](local_78,(long)local_98);
      *pdVar5 = 0.0;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x83e121);
  local_bc = 0;
  do {
    while( true ) {
      bVar3 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70);
      if (bVar3) {
        FindLargest(in_stack_fffffffffffffdc8);
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd68);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70);
      }
      pvVar6 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      local_e8 = *pvVar6;
      row_00 = (IndexedVector *)std::valarray<double>::operator[](local_78,(long)local_e8);
      local_f0 = (double)(row_00->elements_)._M_size;
      if (((local_f0 == 0.0) && (!NAN(local_f0))) ||
         (IVar4 = Control::InterruptCheck(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4),
         local_34 = IVar4, IVar4 != 0)) goto LAB_0083e8bf;
      Basis::SolveForUpdate
                (in_stack_fffffffffffffdc0,(Int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                 in_stack_fffffffffffffdb0);
      ignore_fixed = (undefined1)((uint)IVar4 >> 0x18);
      std::valarray<double>::operator[](local_60,(long)local_e8);
      local_f4 = ScaleFtran(in_stack_fffffffffffffda0,(double)in_stack_fffffffffffffd98,
                            (Vector *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      iVar9 = (int)local_80;
      pdVar5 = IndexedVector::operator[]
                         ((IndexedVector *)
                          CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          in_stack_fffffffffffffd5c);
      local_100 = *pdVar5;
      std::abs(iVar9);
      if (extraout_XMM0_Qa <= local_40) break;
      local_110 = 0.0;
      local_120 = local_70;
      local_118 = &local_110;
      local_108 = extraout_XMM0_Qa;
      for_each_nonzero<ipx::Maxvolume::Driver(ipx::Basis&,ipx::Maxvolume::Slice&)::__0>
                ((IndexedVector *)in_stack_fffffffffffffda0,
                 (anon_class_16_2_b7367452 *)in_stack_fffffffffffffd98);
      local_124 = Basis::operator[]((Basis *)CONCAT44(in_stack_fffffffffffffd64,
                                                      in_stack_fffffffffffffd60),
                                    in_stack_fffffffffffffd5c);
      Basis::TableauRow(in_stack_fffffffffffffe60,(Int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        in_stack_fffffffffffffe50,row_00,(bool)ignore_fixed);
      iVar9 = (int)local_88;
      pdVar5 = IndexedVector::operator[]
                         ((IndexedVector *)
                          CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          in_stack_fffffffffffffd5c);
      local_130 = *pdVar5;
      std::abs(iVar9);
      if (extraout_XMM0_Qa_00 < 0.001) {
        poVar7 = Control::Debug((Control *)*in_RDI,3);
        poVar8 = std::operator<<(poVar7," |pivot| ");
        std::abs((int)poVar7);
        sci2_abi_cxx11_((double)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        in_stack_fffffffffffffdd8 = (Control *)std::operator<<(poVar8,local_150);
        std::operator<<((ostream *)in_stack_fffffffffffffdd8,"(maxvolume)\n");
        std::__cxx11::string::~string(local_150);
      }
      in_stack_fffffffffffffdd4 =
           Basis::ExchangeIfStable
                     (in_stack_fffffffffffffd98,(Int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                      (Int)in_stack_fffffffffffffd90,(double)in_stack_fffffffffffffd88,
                      CONCAT13(in_stack_fffffffffffffd87,
                               CONCAT12(in_stack_fffffffffffffd86,in_stack_fffffffffffffd84)),
                      (bool *)in_stack_fffffffffffffd78);
      local_34 = in_stack_fffffffffffffdd4;
      if (in_stack_fffffffffffffdd4 != 0) goto LAB_0083e8bf;
      if ((local_151 & 1) != 0) {
        *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) + 1;
        dVar10 = log2(local_108);
        in_RDI[3] = (double)in_RDI[3] + dVar10;
        in_stack_fffffffffffffdc8 =
             (Vector *)std::valarray<double>::operator[](local_60,(long)local_e8);
        dVar10 = (double)in_stack_fffffffffffffdc8->_M_size;
        in_stack_fffffffffffffdc0 =
             (Basis *)std::valarray<double>::operator[](local_68,(long)local_f4);
        pCVar1 = in_stack_fffffffffffffdc0->control_;
        in_stack_fffffffffffffdb8 = std::valarray<double>::operator[](local_68,(long)local_f4);
        dVar11 = *in_stack_fffffffffffffdb8;
        in_stack_fffffffffffffdb0 =
             (IndexedVector *)std::valarray<double>::operator[](local_60,(long)local_124);
        (in_stack_fffffffffffffdb0->elements_)._M_size = (size_t)(1.0 / dVar11);
        in_stack_fffffffffffffda0 =
             (Maxvolume *)std::valarray<double>::operator[](local_60,(long)local_e8);
        in_stack_fffffffffffffd90 = (Control *)(1.0 / (double)in_stack_fffffffffffffda0->control_);
        in_stack_fffffffffffffd98 =
             (Basis *)std::valarray<double>::operator[](local_68,(long)local_f4);
        in_stack_fffffffffffffd98->control_ = in_stack_fffffffffffffd90;
        in_stack_fffffffffffffd88 =
             (IndexedVector *)std::valarray<double>::operator[](local_60,(long)local_e8);
        (in_stack_fffffffffffffd88->elements_)._M_size = 0;
        in_stack_fffffffffffffd87 =
             std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_fffffffffffffd87,
                                 CONCAT16(in_stack_fffffffffffffd86,
                                          CONCAT24(in_stack_fffffffffffffd84,
                                                   in_stack_fffffffffffffd80))),
                        (size_type)in_stack_fffffffffffffd78);
        dVar11 = (double)(byte)in_stack_fffffffffffffd87 - local_110;
        dVar10 = dVar10 * local_130;
        for_each_nonzero<ipx::Maxvolume::Driver(ipx::Basis&,ipx::Maxvolume::Slice&)::__1>
                  ((IndexedVector *)in_stack_fffffffffffffda0,
                   (anon_class_24_3_eb8ddd5c *)in_stack_fffffffffffffd98);
        in_stack_fffffffffffffd86 =
             std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_fffffffffffffd87,
                                 CONCAT16(in_stack_fffffffffffffd86,
                                          CONCAT24(in_stack_fffffffffffffd84,
                                                   in_stack_fffffffffffffd80))),
                        (size_type)in_stack_fffffffffffffd78);
        in_stack_fffffffffffffd70 =
             (Basis *)((double)(byte)in_stack_fffffffffffffd86 + (dVar11 / dVar10) / (double)pCVar1)
        ;
        in_stack_fffffffffffffd78 = std::valarray<double>::operator[](local_78,(long)local_124);
        *in_stack_fffffffffffffd78 = (double)in_stack_fffffffffffffd70;
        in_stack_fffffffffffffd68 =
             (Vector *)std::valarray<double>::operator[](local_78,(long)local_e8);
        in_stack_fffffffffffffd68->_M_size = 0;
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x83e8ba)
        ;
      }
    }
    pdVar5 = std::valarray<double>::operator[](local_78,(long)local_e8);
    *pdVar5 = 0.0;
    pdVar5 = std::valarray<double>::operator[](local_60,(long)local_e8);
    *pdVar5 = 0.0;
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)0x83e38e);
    local_bc = local_bc + 1;
  } while ((local_bc <= local_54) || (local_54 < 0));
LAB_0083e8bf:
  *(int *)((long)in_RDI + 0xc) = local_bc + *(int *)((long)in_RDI + 0xc);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70);
  return local_34;
}

Assistant:

Int Maxvolume::Driver(Basis& basis, Slice& slice) {
    const Model& model = basis.model();
    const Int m = model.rows();
    const Int n = model.cols();
    const SparseMatrix& AI = model.AI();
    Int errflag = 0;

    const double volumetol = std::max(control_.volume_tol(), 1.0);
    const Int maxskip = control_.maxskip_updates();

    Vector& colscale = slice.colscale;
    Vector& invscale_basic = slice.invscale_basic;
    const std::vector<bool>& tblrow_used = slice.tblrow_used;
    Vector& colweights = slice.colweights;
    IndexedVector& lhs = slice.lhs;
    IndexedVector& row = slice.row;
    Vector& work = slice.work;

    // Compute column weights.
    for (Int p = 0; p < m; p++)
        work[p] = tblrow_used[p] ? invscale_basic[p] : 0.0;
    basis.SolveDense(work, work, 'T');
    for (Int j = 0; j < n+m; j++) {
        if (colscale[j]) {
            assert(basis.StatusOf(j) == Basis::NONBASIC);
            double sum = DotColumn(AI, j, work);
            colweights[j] = sum * colscale[j];
        }
        else
            colweights[j] = 0.0;
    }

    std::vector<Int> candidates;
    Int skipped = 0;
    while (true) {
        // Pick column with maximum weight.
        if (candidates.empty()) {
            candidates = FindLargest(colweights);
            assert(!candidates.empty());
        }
        Int jn = candidates.back();
        assert(jn >= 0 && jn < n+m);
        const double weight = colweights[jn];
        if (weight == 0.0)
            break;
        assert(basis.StatusOf(jn) == Basis::NONBASIC);
        assert(colscale[jn] > 0.0);

        if ((errflag = control_.InterruptCheck()) != 0)
            break;

        // Find maximum scaled FTRAN entry.
        basis.SolveForUpdate(jn, lhs);
        const Int pmax = ScaleFtran(colscale[jn], invscale_basic, lhs);
        const double scaled_pivot = lhs[pmax];
        const double vmax = std::abs(scaled_pivot);

        // Skip the column if exchange does not increase volume enough.
        if (vmax <= volumetol) {
            colweights[jn] = 0.0;
            colscale[jn] = 0.0;
            candidates.pop_back();
            if (++skipped > maxskip && maxskip >= 0)
                break;
            continue;
        }

        // Recompute column weight from FTRAN.
        double weight_recomp = 0.0;
        auto sum_used =  [&](Int p, double x) {
            if (tblrow_used[p])
                weight_recomp += x;
        };
        for_each_nonzero(lhs, sum_used);
        assert(std::isfinite(weight_recomp));

        // Update basis.
        const Int jb = basis[pmax];
        basis.TableauRow(jb, lhs, row, true);
        const double pivot = row[jn];
        if (std::abs(pivot) < 1e-3) {
            control_.Debug(3)
                << " |pivot| " << sci2(std::abs(pivot))
                << "(maxvolume)\n";
        }
        bool exchanged;
        errflag = basis.ExchangeIfStable(jb, jn, pivot, 0, &exchanged);
        if (errflag)
            break;
        if (!exchanged)         // factorization was unstable, try again
            continue;
        updates_++;
        volinc_ += std::log2(vmax);

        // Update colscale and invscale_basic.
        const double dn = colscale[jn];
        const double dbinv = invscale_basic[pmax];
        assert(colscale[jb] == 0.0);
        colscale[jb] = 1.0 / invscale_basic[pmax];
        invscale_basic[pmax] = 1.0 / colscale[jn];
        colscale[jn] = 0.0;
        assert(std::isfinite(colscale[jb]));
        assert(std::isfinite(invscale_basic[pmax]));

        // Update column weights.
        const double alpha = (tblrow_used[pmax] - weight_recomp) / (dn*pivot);
        assert(std::isfinite(alpha));
        auto add = [&](Int j, double x) {
            colweights[j] += alpha * x * colscale[j];
        };
        for_each_nonzero(row, add);
        colweights[jb] = tblrow_used[pmax] + alpha/dbinv;
        colweights[jn] = 0.0;
        candidates.clear();
    }

    skipped_ += skipped;
    return errflag;
}